

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool process_import(CompilationContext *ctx)

{
  void *in_RDI;
  vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  keepRanges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directives;
  int importEndCol;
  char *importPtr;
  ImportParser importParser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001c8;
  vector<sqimportparser::ModuleImport,_std::allocator<sqimportparser::ModuleImport>_>
  *in_stack_000001d0;
  int *in_stack_000001d8;
  int *in_stack_000001e0;
  char **in_stack_000001e8;
  ImportParser *in_stack_000001f0;
  vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  *in_stack_00000200;
  ImportParser *this;
  char *to;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar1;
  char local_70 [28];
  undefined4 local_54;
  undefined8 local_50;
  ImportParser local_48;
  void *local_10;
  byte local_1;
  
  this = &local_48;
  local_10 = in_RDI;
  sqimportparser::ImportParser::ImportParser(this,error_cb,in_RDI);
  local_50 = std::__cxx11::string::c_str();
  *(undefined4 *)((long)local_10 + 0xf0) = 1;
  local_54 = 0;
  to = local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1322a2);
  std::
  vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  ::vector((vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
            *)0x1322b1);
  local_1 = sqimportparser::ImportParser::parse
                      (in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                       in_stack_000001d0,in_stack_000001c8,in_stack_00000200);
  if ((bool)local_1) {
    uVar1 = local_1;
    std::__cxx11::string::c_str();
    sqimportparser::ImportParser::replaceImportBySpaces
              ((char *)CONCAT17(uVar1,in_stack_ffffffffffffff60),to,
               (vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
                *)this);
  }
  std::
  vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
  ::~vector((vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
             *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return (bool)(local_1 & 1);
}

Assistant:

bool process_import(CompilationContext & ctx)
{
  ImportParser importParser(error_cb, &ctx);
  const char * importPtr = ctx.code.c_str();
  ctx.firstLineAfterImport = 1;
  int importEndCol = 0;
  vector<string> directives;
  vector<pair<const char *, const char *>> keepRanges;
  if (!importParser.parse(&importPtr, ctx.firstLineAfterImport, importEndCol, ctx.imports, &directives, &keepRanges))
    return false;

  (void) importEndCol;
  (void) directives;

  ImportParser::replaceImportBySpaces((char *)ctx.code.c_str(), (char *)importPtr, keepRanges);

  return true;
}